

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::
     BuiltinDeserializer<std::unique_ptr<Person,_std::default_delete<Person>_>,_void>::
     deserialize<InputStream>
               (unique_ptr<Person,_std::default_delete<Person>_> *opt,InputStream *istream)

{
  Person *__ptr;
  uint8_t discriminator;
  char local_19;
  
  std::istream::read((char *)istream->stream,(long)&local_19);
  if (local_19 == '\0') {
    __ptr = (opt->_M_t).super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
            super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
            super__Head_base<0UL,_Person_*,_false>._M_head_impl;
    (opt->_M_t).super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
    super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
    super__Head_base<0UL,_Person_*,_false>._M_head_impl = (Person *)0x0;
    if (__ptr != (Person *)0x0) {
      std::default_delete<Person>::operator()((default_delete<Person> *)opt,__ptr);
    }
  }
  else {
    BuiltinDeserializer<std::unique_ptr<Person,std::default_delete<Person>>,void>::
    make_nonempty<std::unique_ptr<Person,std::default_delete<Person>>>(opt);
    CustomDeserializer<Person,_void>::deserialize
              ((opt->_M_t).super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
               super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
               super__Head_base<0UL,_Person_*,_false>._M_head_impl,istream);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }